

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O3

void __thiscall duel::printField(duel *this)

{
  hand *phVar1;
  field *this_00;
  uint uVar2;
  _Map_pointer ppcVar3;
  long lVar4;
  bool bVar5;
  duel *pdVar6;
  char cVar7;
  ostream *poVar8;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  ulong uVar12;
  string __str;
  string local_78;
  duel *local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x32;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player 2",8);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x32;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| deck",6);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x5f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| [",3);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
  ppcVar3 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  uVar9 = ((long)(this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppcVar3 -
            (long)(this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 10;
  uVar12 = uVar9 >> 1;
  cVar11 = '\x01';
  if (0x13 < uVar9) {
    uVar9 = uVar12;
    cVar7 = '\x04';
    do {
      cVar11 = cVar7;
      if (uVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00103467;
      }
      if (uVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00103467;
      }
      if (uVar9 < 10000) goto LAB_00103467;
      bVar5 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar7 = cVar11 + '\x04';
    } while (bVar5);
    cVar11 = cVar11 + '\x01';
  }
LAB_00103467:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar12);
  *(long *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) =
       (long)(int)(0x61 - (uint)local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| hand",6);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x5f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  uVar2 = this->player;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
  phVar1 = &this->hand2;
  if (uVar2 == 2) {
    hand::printHand_abi_cxx11_(&local_78,phVar1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                        CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
    hand::printHand_abi_cxx11_(&local_50,phVar1);
    *(long *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) =
         (long)(0x6300000000 - (local_50._M_string_length << 0x20)) >> 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    hand::printHidden_abi_cxx11_(&local_78,phVar1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                        CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
    hand::printHidden_abi_cxx11_(&local_50,phVar1);
    *(long *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) =
         (long)(0x6300000000 - (local_50._M_string_length << 0x20)) >> 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| pile",6);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x5f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
  this_00 = &this->field2;
  field::printPile_abi_cxx11_(&local_78,this_00);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                      CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
  field::printPile_abi_cxx11_(&local_50,this_00);
  *(long *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) =
       (long)(0x6300000000 - (local_50._M_string_length << 0x20)) >> 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| score",7);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x5e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  uVar2 = this_00->pile;
  cVar11 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar7 = '\x04';
    do {
      cVar11 = cVar7;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_001038ea;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_001038ea;
      }
      if (uVar10 < 10000) goto LAB_001038ea;
      bVar5 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar7 = cVar11 + '\x04';
    } while (bVar5);
    cVar11 = cVar11 + '\x01';
  }
LAB_001038ea:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar2);
  *(long *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) =
       0x6100000000 -
       (CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length) << 0x20) >> 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar4 = *(long *)(std::cout + -0x18);
  uVar2 = (this->field1).pile;
  cVar11 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar7 = '\x04';
    do {
      cVar11 = cVar7;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_001039d3;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_001039d3;
      }
      if (uVar10 < 10000) goto LAB_001039d3;
      bVar5 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar7 = cVar11 + '\x04';
    } while (bVar5);
    cVar11 = cVar11 + '\x01';
  }
LAB_001039d3:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar2);
  *(long *)(std::__throw_out_of_range + lVar4) =
       0x61 - CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} |",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 100;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"score |",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  lVar4 = *(long *)(std::cout + -0x18);
  field::printPile_abi_cxx11_(&local_78,&this->field1);
  *(long *)(std::__throw_out_of_range + lVar4) =
       99 - CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  field::printPile_abi_cxx11_(&local_78,&this->field1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                      CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
  pdVar6 = local_58;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," |",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 100;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pile |",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  phVar1 = &pdVar6->hand1;
  lVar4 = *(long *)(std::cout + -0x18);
  if (pdVar6->player == 1) {
    hand::printHand_abi_cxx11_(&local_78,phVar1);
    *(long *)(std::__throw_out_of_range + lVar4) =
         99 - CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    hand::printHand_abi_cxx11_(&local_78,phVar1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                        CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," |",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    hand::printHidden_abi_cxx11_(&local_78,phVar1);
    *(long *)(std::__throw_out_of_range + lVar4) =
         99 - CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
    hand::printHidden_abi_cxx11_(&local_78,phVar1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                        CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," |",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 100;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hand |",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  lVar4 = *(long *)(std::cout + -0x18);
  ppcVar3 = (pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  uVar9 = ((long)(pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppcVar3 -
            (long)(pdVar6->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 10;
  uVar12 = uVar9 >> 1;
  cVar11 = '\x01';
  if (0x13 < uVar9) {
    uVar9 = uVar12;
    cVar7 = '\x04';
    do {
      cVar11 = cVar7;
      if (uVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00103f41;
      }
      if (uVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00103f41;
      }
      if (uVar9 < 10000) goto LAB_00103f41;
      bVar5 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar7 = cVar11 + '\x04';
    } while (bVar5);
    cVar11 = cVar11 + '\x01';
  }
LAB_00103f41:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar12);
  *(long *)(std::__throw_out_of_range + lVar4) =
       0x61 - CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] |",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 100;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deck |",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x32;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player 1",8);
  *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 0x32;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void duel::printField() {
    cout << "[" << setw(50) << "player 2" << setw(50) << "]" << endl;
    cout << "| deck" << setw(95) << "|" << endl;
    cout << "| [" << deck.size()/2 << "]" << setw(97-to_string(deck.size()/2).size()) << "|" << endl;
    cout << "| hand" << setw(95) << "|" << endl;
    if(player == 2) cout << "| " << hand2.printHand() << setw(99-hand2.printHand().size()) << "|" << endl;
    else cout << "| " << hand2.printHidden() << setw(99-hand2.printHidden().size()) << "|" << endl;
    cout << "| pile" << setw(95) << "|" << endl;
    cout << "| " << field2.printPile() << setw(99-field2.printPile().size()) << "|" << endl;
    cout << "| score" << setw(94) << "|" << endl;
    cout << "| " << "{" << field2.getPile() << "}" << setw(97-to_string(field2.getPile()).size()) << "|" << endl;
    cout.width(97-to_string(field1.getPile()).size()); cout << left << "|" << right << "{" << field1.getPile() << "} |" << endl;
    cout << "|" << setw(100) << "score |" << endl;
    cout.width(99-field1.printPile().size()); cout << left << "|" << right << field1.printPile() << " |" << endl;
    cout << "|" << setw(100) << "pile |" << endl;
    if(player == 1) {
        cout.width(99-hand1.printHand().size()); cout << left << "|" << right << hand1.printHand() << " |" << endl;
    }
    else {
        cout.width(99-hand1.printHidden().size()); cout << left << "|" << right << hand1.printHidden() << " |" << endl;
    }
    cout << "|" << setw(100) << "hand |" << endl;
    cout.width(97-to_string(deck.size()/2).size()); cout << left << "|" << right << "[" << deck.size()/2 << "] |" << endl;
    cout << "|" << setw(100) << "deck |" << endl;
    cout << "[" << setw(50) << "player 1" << setw(50) << "]" << endl;
}